

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_enc_refs.cpp
# Opt level: O0

void set_st_cfg_to_frm(EncFrmStatus *frm,RK_S32 seq_idx,MppEncRefStFrmCfg *st_cfg)

{
  MppEncRefStFrmCfg *st_cfg_local;
  RK_S32 seq_idx_local;
  EncFrmStatus *frm_local;
  
  memset(frm,0,8);
  frm->val = frm->val & 0xffffffffffff | (ulong)(uint)seq_idx << 0x30;
  frm->val = frm->val & 0xfffffffffffffffe | 1;
  frm->val = frm->val & 0xffffffffffffffdf | (ulong)(seq_idx == 0) << 5;
  frm->val = frm->val & 0xffffffffffffffef | (ulong)((uint)(frm->val >> 5) & 1) << 4;
  frm->val = frm->val & 0xffffffffffffffbf | ((ulong)(uint)st_cfg->is_non_ref & 1) << 6;
  frm->val = frm->val & 0xffffffffffffff7f;
  frm->val = frm->val & 0xffffffffffff0fff | ((ulong)(uint)st_cfg->temporal_id & 0xf) << 0xc;
  frm->val = frm->val & 0xffffffffffc0ffff | ((ulong)st_cfg->ref_mode & 0x3f) << 0x10;
  frm->val = frm->val & 0xffffffffc03fffff | ((ulong)(uint)st_cfg->ref_arg & 0xff) << 0x16;
  if ((enc_refs_debug & 4) != 0) {
    _dump_frm(frm,"set_st_cfg_to_frm",0x13f);
  }
  return;
}

Assistant:

static void set_st_cfg_to_frm(EncFrmStatus *frm, RK_S32 seq_idx,
                              MppEncRefStFrmCfg *st_cfg)
{
    memset(frm, 0, sizeof(*frm));

    frm->seq_idx = seq_idx;
    frm->valid = 1;
    frm->is_idr = (seq_idx == 0);
    frm->is_intra = frm->is_idr;
    frm->is_non_ref = st_cfg->is_non_ref;
    frm->is_lt_ref = 0;
    frm->temporal_id = st_cfg->temporal_id;
    frm->ref_mode = st_cfg->ref_mode;
    frm->ref_arg = st_cfg->ref_arg;

    if (enc_refs_debug & MPP_ENC_REFS_DBG_FRM)
        dump_frm(frm);
}